

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

void __thiscall
immutable::ref<immutable::rrb<int,_false,_5>_>::~ref(ref<immutable::rrb<int,_false,_5>_> *this)

{
  uint32_t uVar1;
  rrb<int,_false,_5> *__ptr;
  leaf_node<int,_false> *__ptr_00;
  internal_node<int,_false> *p_node;
  
  __ptr = this->ptr;
  if ((__ptr != (rrb<int,_false,_5> *)0x0) &&
     (uVar1 = __ptr->_ref_count, __ptr->_ref_count = uVar1 - 1, uVar1 == 1)) {
    __ptr_00 = (__ptr->tail).ptr;
    if ((__ptr_00 != (leaf_node<int,_false> *)0x0) &&
       (uVar1 = __ptr_00->_ref_count, __ptr_00->_ref_count = uVar1 - 1, uVar1 == 1)) {
      free(__ptr_00);
    }
    p_node = (internal_node<int,_false> *)(__ptr->root).ptr;
    if (p_node != (internal_node<int,_false> *)0x0) {
      if (p_node->type == LEAF_NODE) {
        uVar1 = p_node->_ref_count;
        p_node->_ref_count = uVar1 - 1;
        if (uVar1 == 1) {
          free(p_node);
        }
      }
      else {
        rrb_details::release<int>(p_node);
      }
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }